

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

bool __thiscall Matrix::ApplyRowPermutation(Matrix *this,Permutation *permutation)

{
  bool bVar1;
  int iVar2;
  int source_row;
  bool bVar3;
  int i;
  Matrix result;
  Matrix local_60;
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  local_40;
  
  iVar2 = Permutation::Size(permutation);
  if (iVar2 == this->n_) {
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::vector(&local_40,&this->elements_);
    Matrix(&local_60,&local_40);
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::~vector(&local_40);
    bVar3 = false;
    for (iVar2 = 0; iVar2 < this->n_; iVar2 = iVar2 + 1) {
      source_row = Permutation::At(permutation,iVar2);
      bVar1 = CopyRow(&local_60,this,source_row,iVar2);
      bVar3 = (bool)(bVar3 | bVar1);
    }
    operator=(this,&local_60);
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::~vector(&local_60.elements_);
    return bVar3;
  }
  __assert_fail("permutation.Size() == n_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/matrix.cpp"
                ,0x119,"bool Matrix::ApplyRowPermutation(const Permutation &)");
}

Assistant:

bool Matrix::ApplyRowPermutation(const Permutation& permutation) {
  assert(permutation.Size() == n_);
  Matrix result(elements_);
  bool answer = false;
  for (int i = 0; i < n_; ++i) {
    answer |= result.CopyRow(*this, permutation.At(i), i);
  }
  operator=(result);

  return answer;
}